

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::test_Capitalize::test_method(test_Capitalize *this)

{
  string str;
  string str_00;
  string str_01;
  int iVar1;
  char *__end;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 *puVar4;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 *puVar5;
  undefined8 in_stack_fffffffffffffe60;
  char *pcVar6;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  lazy_ostream local_170;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined **local_128;
  undefined1 local_120;
  undefined1 *local_118;
  char **local_110;
  string *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined1 *local_f0;
  string **local_e8;
  char *local_e0;
  char *local_d8;
  assertion_result local_d0;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x50f;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"","");
  str._M_string_length = in_stack_fffffffffffffe50;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  str.field_2._8_8_ = in_stack_fffffffffffffe60;
  Capitalize(&local_58,str);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"");
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  local_e8 = &local_108;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_01388fc8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  local_130 = "";
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_01389558;
  local_118 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_108 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_170,1,2,REQUIRE,0xf50ecf,(size_t)&local_e0,0x50f,&local_100,"\"\"",
             &local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x510;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"bitcoin","");
  str_00._M_string_length = in_stack_fffffffffffffe50;
  str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  str_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  str_00.field_2._8_8_ = in_stack_fffffffffffffe60;
  Capitalize(&local_58,str_00);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"Bitcoin");
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_01388fc8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_108;
  local_130 = "Bitcoin";
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_01389798;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_108 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_170,1,2,REQUIRE,0xf50ede,(size_t)&local_e0,0x510,&local_100,
             "\"Bitcoin\"",&local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  puVar4 = &boost::unit_test::basic_cstring<char_const>::null;
  puVar5 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x511;
  file_01.m_begin = &stack0xfffffffffffffe60;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
             (size_t)&stack0xfffffffffffffe50,msg_01);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"","");
  str_01._M_string_length = (size_type)puVar4;
  str_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  str_01.field_2._M_allocated_capacity = (size_type)puVar5;
  str_01.field_2._8_8_ = pcVar6;
  Capitalize(&local_58,str_01);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"");
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_01388fc8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_108;
  local_130 = "";
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_01389718;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  local_108 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_170,1,2,REQUIRE,0xf50f06,(size_t)&local_e0,0x511,&local_100,
             "\"\\x00\\xfe\\xff\"",&local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_Capitalize)
{
    BOOST_CHECK_EQUAL(Capitalize(""), "");
    BOOST_CHECK_EQUAL(Capitalize("bitcoin"), "Bitcoin");
    BOOST_CHECK_EQUAL(Capitalize("\x00\xfe\xff"), "\x00\xfe\xff");
}